

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath __thiscall
testing::internal::FilePath::ConcatPaths(FilePath *this,FilePath *directory,FilePath *relative_path)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar2;
  FilePath FVar3;
  FilePath dir;
  String local_38;
  FilePath local_28;
  
  pcVar1 = (directory->pathname_).c_str_;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    (this->pathname_).c_str_ = (char *)0x0;
    (this->pathname_).length_ = 0;
    String::operator=(&this->pathname_,&relative_path->pathname_);
    sVar2 = extraout_RDX_02;
  }
  else {
    RemoveTrailingPathSeparator(&local_28);
    String::Format((char *)&local_38,"%s%c%s",local_28.pathname_.c_str_,0x2f,
                   (relative_path->pathname_).c_str_);
    FilePath(this,&local_38);
    sVar2 = extraout_RDX;
    if (local_38.c_str_ != (char *)0x0) {
      operator_delete__(local_38.c_str_);
      sVar2 = extraout_RDX_00;
    }
    if (local_28.pathname_.c_str_ != (char *)0x0) {
      operator_delete__(local_28.pathname_.c_str_);
      sVar2 = extraout_RDX_01;
    }
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(String::Format("%s%c%s", dir.c_str(), kPathSeparator,
                                 relative_path.c_str()));
}